

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O1

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,vector<int,_std::allocator<int>_> *embd_inp)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  ggml_tensor *pgVar4;
  ggml_cgraph *pgVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  undefined4 in_register_00000034;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  int32_t v;
  long local_f0;
  int local_d4;
  long local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  float local_a0;
  int local_9c;
  ggml_cgraph *local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  undefined8 local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  local_b0 = CONCAT44(in_register_00000034,n_past);
  piVar2 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar3 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  local_c0 = (ulong)(model->hparams).n_embd;
  uVar1 = (model->hparams).n_layer;
  local_b8 = (long)(model->hparams).n_ctx;
  local_60 = (long)(model->hparams).n_head;
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf_size == '\0'
     ) {
    iVar6 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf_size);
    if (iVar6 != 0) {
      lVar8 = ggml_tensor_overhead();
      lVar16 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar16 + lVar8 * 0x1000;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf_size);
    }
  }
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf == '\0') {
    iVar6 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf);
    if (iVar6 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&gpt2_graph::buf,gpt2_graph::buf_size,(allocator_type *)&local_d4);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf);
    }
  }
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar7 = ggml_init();
  local_98 = (ggml_cgraph *)ggml_new_graph_custom(uVar7,0x1000,0);
  uVar14 = (uint)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  lVar16 = (long)(int)uVar14;
  local_c8 = ggml_view_1d(uVar7,model->embd,lVar16,0);
  pgVar4 = model->embd;
  piVar2 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar8 = ggml_element_size(local_c8);
  ggml_backend_tensor_set(pgVar4,piVar2,0,lVar8 * lVar16);
  local_d0 = ggml_view_1d(uVar7,model->position,lVar16,0);
  local_a8 = lVar16;
  if (0 < (int)uVar14) {
    lVar8 = 0;
    uVar17 = local_b0 & 0xffffffff;
    do {
      local_d4 = (int)uVar17;
      ggml_backend_tensor_set(model->position,&local_d4,lVar8,4);
      uVar17 = (ulong)((int)uVar17 + 1);
      lVar8 = lVar8 + 4;
    } while ((ulong)(uVar14 & 0x7fffffff) << 2 != lVar8);
  }
  fVar18 = (float)(model->hparams).n_embd / (float)(model->hparams).n_head;
  if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  lVar8 = local_d0;
  uVar9 = ggml_get_rows(uVar7,model->wte,local_c8);
  uVar10 = ggml_get_rows(uVar7,model->wpe,lVar8);
  lVar8 = ggml_add(uVar7,uVar9,uVar10);
  ggml_set_name(lVar8,"inpL");
  ggml_set_name(*(undefined8 *)(lVar8 + 0x98),"wte");
  ggml_set_name(*(undefined8 *)(lVar8 + 0xa0),"wpe");
  if (0 < (int)uVar1) {
    local_a0 = 1.0 / fVar18;
    local_68 = local_c0 * 4;
    local_70 = local_c0 * 8;
    local_88 = (long)(int)((int)local_c0 * uVar14);
    iVar6 = uVar14 + (int)local_b0;
    local_78 = (long)iVar6;
    lVar11 = (long)(iVar6 * (int)local_c0);
    local_b8 = local_b8 * local_c0;
    local_90 = (long)(int)local_b0 * local_c0;
    local_80 = (ulong)uVar1 * 0x60;
    lVar16 = 0;
    local_f0 = 0;
    iVar6 = 0;
    do {
      local_d0 = lVar8;
      local_9c = iVar6;
      uVar9 = ggml_norm((model->hparams).eps,uVar7,lVar8);
      ggml_format_name(uVar9,"l%d.norm",iVar6);
      uVar9 = ggml_mul(uVar7,uVar9,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_g + lVar16));
      lVar8 = ggml_add(uVar7,uVar9,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_b + lVar16));
      ggml_format_name(lVar8,"l%d.ln_1_b",iVar6);
      ggml_format_name(*(undefined8 *)(lVar8 + 0x98),"l%d.ln_1_g",iVar6);
      uVar9 = ggml_mul_mat(uVar7,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w
                                  + lVar16),lVar8);
      ggml_format_name(uVar9,"l%d.attn_w",iVar6);
      local_c8 = lVar16;
      lVar16 = ggml_add(uVar7,uVar9,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_attn_attn_b + lVar16)
                       );
      ggml_format_name(lVar16,"l%d.attn_b",iVar6);
      lVar8 = local_a8;
      uVar17 = local_c0;
      uVar9 = ggml_view_2d(uVar7,lVar16,local_c0,local_a8,*(undefined8 *)(lVar16 + 0x38),0);
      uVar10 = ggml_view_2d(uVar7,lVar16,uVar17,lVar8,*(undefined8 *)(lVar16 + 0x38),local_68);
      uVar12 = ggml_view_2d(uVar7,lVar16,uVar17,lVar8,*(undefined8 *)(lVar16 + 0x38),local_70);
      iVar6 = local_9c;
      local_50 = uVar9;
      ggml_format_name(uVar9,"l%d.Qcur",local_9c);
      ggml_format_name(uVar10,"l%d.Kcur",iVar6);
      ggml_format_name(uVar12,"l%d.Vcur",iVar6);
      if (0 < (int)lVar8) {
        pgVar4 = model->memory_k;
        lVar13 = ggml_element_size(pgVar4);
        lVar16 = local_88;
        lVar8 = local_90 + local_f0;
        local_58 = ggml_view_1d(uVar7,pgVar4,local_88,lVar13 * lVar8);
        pgVar4 = model->memory_v;
        lVar13 = ggml_element_size(pgVar4);
        uVar9 = ggml_view_1d(uVar7,pgVar4,lVar16,lVar8 * lVar13);
        uVar10 = ggml_cpy(uVar7,uVar10,local_58);
        pgVar5 = local_98;
        ggml_build_forward_expand(local_98,uVar10);
        uVar9 = ggml_cpy(uVar7,uVar12,uVar9);
        lVar8 = local_a8;
        ggml_build_forward_expand(pgVar5,uVar9);
      }
      lVar16 = local_60;
      lVar15 = (long)(int)((long)((ulong)(uint)((int)local_c0 >> 0x1f) << 0x20 |
                                 local_c0 & 0xffffffff) / (long)(int)local_60);
      uVar9 = ggml_cont_3d(uVar7,local_50,lVar15,local_60,lVar8);
      uVar9 = ggml_permute(uVar7,uVar9,0,2,1,3);
      ggml_format_name(uVar9,"l%d.Q",iVar6);
      pgVar4 = model->memory_k;
      lVar8 = ggml_element_size(pgVar4);
      uVar10 = ggml_view_1d(uVar7,pgVar4,lVar11,lVar8 * local_f0);
      lVar8 = local_78;
      uVar10 = ggml_reshape_3d(uVar7,uVar10,lVar15,lVar16,local_78);
      uVar10 = ggml_permute(uVar7,uVar10,0,2,1,3);
      ggml_format_name(uVar10,"l%d.K",iVar6);
      uVar9 = ggml_mul_mat(uVar7,uVar10,uVar9);
      ggml_format_name(uVar9,"l%d.KQ",iVar6);
      uVar9 = ggml_scale(local_a0,uVar7,uVar9);
      ggml_format_name(uVar9,"l%d.KQ_scaled",iVar6);
      uVar9 = ggml_diag_mask_inf(uVar7,uVar9,local_b0);
      ggml_format_name(uVar9,"l%d.KQ_masked",iVar6);
      uVar9 = ggml_soft_max(uVar7,uVar9);
      ggml_format_name(uVar9,"l%d.KQ_soft_max",iVar6);
      pgVar4 = model->memory_v;
      lVar13 = ggml_element_size(pgVar4);
      uVar10 = ggml_view_1d(uVar7,pgVar4,lVar11,lVar13 * local_f0);
      uVar10 = ggml_reshape_3d(uVar7,uVar10,lVar15,lVar16,lVar8);
      uVar10 = ggml_permute(uVar7,uVar10,1,2,0,3);
      uVar10 = ggml_cont_3d(uVar7,uVar10,lVar8,lVar15,lVar16);
      uVar9 = ggml_mul_mat(uVar7,uVar10,uVar9);
      ggml_format_name(uVar9,"l%d.KQV",iVar6);
      uVar9 = ggml_permute(uVar7,uVar9,0,2,1);
      ggml_format_name(uVar9,"l%d.KQV_merged",iVar6);
      uVar9 = ggml_cont_2d(uVar7,uVar9,local_c0,local_a8);
      ggml_format_name(uVar9,"l%d.KQV_merged_contiguous",iVar6);
      lVar16 = local_c8;
      uVar9 = ggml_mul_mat(uVar7,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w
                                  + local_c8),uVar9);
      ggml_format_name(uVar9,"l%d.attn_proj_w",iVar6);
      uVar9 = ggml_add(uVar7,uVar9,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_attn_proj_b + lVar16));
      ggml_format_name(uVar9,"l%d.attn_proj_b",iVar6);
      uVar9 = ggml_add(uVar7,uVar9,local_d0);
      ggml_format_name(uVar9,"l%d.add",iVar6);
      uVar10 = ggml_norm((model->hparams).eps,uVar7,uVar9);
      ggml_format_name(uVar10,"l%d.FFnorm",iVar6);
      uVar10 = ggml_mul(uVar7,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->ln_2_g + lVar16));
      lVar8 = ggml_add(uVar7,uVar10,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_2_b + lVar16));
      ggml_format_name(lVar8,"l%d.ln_2_b",iVar6);
      ggml_format_name(*(undefined8 *)(lVar8 + 0x98),"l%d.ln_2_g",iVar6);
      uVar10 = ggml_mul_mat(uVar7,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                   lVar16),lVar8);
      ggml_format_name(uVar10,"l%d.mlp_fc_w",iVar6);
      uVar10 = ggml_add(uVar7,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_b + lVar16));
      ggml_format_name(uVar10,"l%d.mlp_fc_b",iVar6);
      uVar10 = ggml_gelu(uVar7,uVar10);
      ggml_format_name(uVar10,"l%d.gelu",iVar6);
      uVar10 = ggml_mul_mat(uVar7,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w
                                   + lVar16),uVar10);
      ggml_format_name(uVar10,"l%d.mlp_proj_w",iVar6);
      uVar10 = ggml_add(uVar7,uVar10,
                        *(undefined8 *)
                         ((long)&((model->layers).
                                  super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_b + lVar16))
      ;
      ggml_format_name(uVar10,"l%d.mlp_proj_b",iVar6);
      lVar8 = ggml_add(uVar7,uVar10,uVar9);
      ggml_format_name(lVar8,"l%d.add2",iVar6);
      iVar6 = iVar6 + 1;
      local_f0 = local_f0 + local_b8;
      lVar16 = lVar16 + 0x60;
    } while (local_80 != lVar16);
  }
  uVar9 = ggml_norm((model->hparams).eps,uVar7,lVar8);
  ggml_format_name(uVar9,"out_norm");
  uVar9 = ggml_mul(uVar7,uVar9,model->ln_f_g);
  lVar8 = ggml_add(uVar7,uVar9,model->ln_f_b);
  ggml_format_name(lVar8,"out_ln_f_b");
  ggml_format_name(*(undefined8 *)(lVar8 + 0x98),"out_ln_f_g");
  uVar9 = ggml_mul_mat(uVar7,model->lm_head,lVar8);
  ggml_format_name(uVar9,"out_lm_head");
  pgVar5 = local_98;
  ggml_build_forward_expand(local_98,uVar9);
  ggml_free(uVar7);
  return pgVar5;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_view_1d(ctx, model.embd, N, 0);

    // set inputs
    // TODO: move to gpt2_eval
    ggml_backend_tensor_set(model.embd, embd_inp.data(), 0, N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_view_1d(ctx, model.position, N, 0);
    for (int i = 0; i < N; ++i) {
        int32_t v = n_past + i;
        ggml_backend_tensor_set(model.position, &v, i*sizeof(int32_t), sizeof(v));
    }

    const float KQ_scale = 1.0f/sqrtf(float(model.hparams.n_embd)/model.hparams.n_head);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));
    ggml_set_name(inpL, "inpL");
    ggml_set_name(inpL->src[0], "wte");
    ggml_set_name(inpL->src[1], "wpe");

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);
            ggml_format_name(cur, "l%d.norm", il);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
            ggml_format_name(cur, "l%d.ln_1_b", il);
            ggml_format_name(cur->src[0], "l%d.ln_1_g", il);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
            ggml_format_name(cur, "l%d.attn_b", il);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            ggml_format_name(Qcur, "l%d.Qcur", il);
            ggml_format_name(Kcur, "l%d.Kcur", il);
            ggml_format_name(Vcur, "l%d.Vcur", il);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);
            ggml_format_name(Q, "l%d.Q", il);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);
            ggml_format_name(K, "l%d.K", il);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);
            ggml_format_name(KQ, "l%d.KQ", il);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale(ctx, KQ, KQ_scale);
            ggml_format_name(KQ_scaled, "l%d.KQ_scaled", il);

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);
            ggml_format_name(KQ_masked, "l%d.KQ_masked", il);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);
            ggml_format_name(KQ_soft_max, "l%d.KQ_soft_max", il);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);
            ggml_format_name(KQV, "l%d.KQV", il);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);
            ggml_format_name(KQV_merged, "l%d.KQV_merged", il);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
            ggml_format_name(cur, "l%d.KQV_merged_contiguous", il);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
            ggml_format_name(cur, "l%d.attn_proj_b", il);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);
        ggml_format_name(cur, "l%d.add", il);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);
                ggml_format_name(cur, "l%d.FFnorm", il);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
                ggml_format_name(cur, "l%d.ln_2_b", il);
                ggml_format_name(cur->src[0], "l%d.ln_2_g", il);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_fc_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);
            ggml_format_name(cur, "l%d.mlp_fc_b", il);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);
            ggml_format_name(cur, "l%d.gelu", il);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
            ggml_format_name(cur, "l%d.mlp_proj_b", il);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
        ggml_format_name(inpL, "l%d.add2", il);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);
        ggml_format_name(inpL, "out_norm");

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
        ggml_format_name(inpL, "out_ln_f_b");
        ggml_format_name(inpL->src[0], "out_ln_f_g");
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_format_name(inpL, "out_lm_head");

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}